

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotShadedEx<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>>
               (char *label_id,GetterXsYs<unsigned_char> *getter1,
               GetterXsYRef<unsigned_char> *getter2,bool fit2)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  uchar *puVar9;
  ImPlotPlot *pIVar10;
  double dVar11;
  double dVar12;
  ImPlotRange *pIVar13;
  ImPlotContext *pIVar14;
  bool bVar15;
  ImU32 col;
  long lVar16;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  uint uVar17;
  byte bVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  byte local_8c;
  byte local_88;
  TransformerLinLin local_84;
  GetterXsYRef<unsigned_char> *local_80;
  GetterXsYs<unsigned_char> *local_78;
  undefined8 local_70;
  undefined4 local_64;
  ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar15 = BeginItem(label_id,1);
  pIVar14 = GImPlot;
  if (bVar15) {
    if (GImPlot->FitThisFrame == true) {
      local_64 = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar2 = getter1->Count;
      if (0 < iVar2) {
        puVar8 = getter1->Xs;
        puVar9 = getter1->Ys;
        iVar3 = getter1->Offset;
        iVar4 = getter1->Stride;
        pIVar10 = GImPlot->CurrentPlot;
        iVar5 = pIVar10->CurrentYAxis;
        uVar6 = (pIVar10->XAxis).Flags;
        pIVar13 = GImPlot->ExtentsY;
        uVar7 = pIVar10->YAxis[iVar5].Flags;
        iVar19 = 0;
        uVar17 = uVar7 & 0x20;
        local_70 = (double)(CONCAT44(local_70._4_4_,uVar6) & 0xffffffff00000020);
        do {
          lVar16 = (long)(((iVar3 + iVar19) % iVar2 + iVar2) % iVar2) * (long)iVar4;
          bVar18 = puVar8[lVar16];
          dVar23 = (double)bVar18;
          bVar1 = puVar9[lVar16];
          dVar22 = (double)bVar1;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((bVar18 != 0) || ((int)local_70 == 0)) {
LAB_001e9498:
              dVar11 = (pIVar14->ExtentsX).Min;
              dVar12 = (pIVar14->ExtentsX).Max;
              uVar20 = -(ulong)(dVar23 < dVar11);
              uVar21 = -(ulong)(dVar12 < dVar23);
              (pIVar14->ExtentsX).Min = (double)(~uVar20 & (ulong)dVar11 | (ulong)dVar23 & uVar20);
              (pIVar14->ExtentsX).Max = (double)(~uVar21 & (ulong)dVar12 | (ulong)dVar23 & uVar21);
            }
          }
          else if (((pIVar10->YAxis[iVar5].Range.Min <= dVar22) &&
                   (dVar22 <= pIVar10->YAxis[iVar5].Range.Max)) &&
                  (local_8c = (byte)((uVar6 & 0x20) >> 5), (bVar18 == 0 & local_8c) == 0))
          goto LAB_001e9498;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((bVar1 != 0) || (uVar17 == 0)) {
LAB_001e9503:
              dVar23 = pIVar13[iVar5].Min;
              dVar11 = pIVar14->ExtentsY[iVar5].Max;
              uVar20 = -(ulong)(dVar22 < dVar23);
              uVar21 = -(ulong)(dVar11 < dVar22);
              pIVar13[iVar5].Min = (double)(~uVar20 & (ulong)dVar23 | (ulong)dVar22 & uVar20);
              pIVar14->ExtentsY[iVar5].Max =
                   (double)(~uVar21 & (ulong)dVar11 | (ulong)dVar22 & uVar21);
            }
          }
          else if ((((pIVar10->XAxis).Range.Min <= dVar23) && (dVar23 <= (pIVar10->XAxis).Range.Max)
                   ) && (local_88 = (byte)(uVar17 >> 5), (bVar1 == 0 & local_88) == 0))
          goto LAB_001e9503;
          iVar19 = iVar19 + 1;
        } while (iVar2 != iVar19);
      }
      if ((fit2) && (iVar2 = getter2->Count, 0 < iVar2)) {
        puVar8 = getter2->Xs;
        iVar3 = getter2->Offset;
        iVar4 = getter2->Stride;
        dVar22 = getter2->YRef;
        pIVar10 = pIVar14->CurrentPlot;
        iVar5 = pIVar10->CurrentYAxis;
        uVar6 = (pIVar10->XAxis).Flags;
        uVar7 = pIVar10->YAxis[iVar5].Flags;
        local_70 = ABS(dVar22);
        bVar18 = dVar22 <= 0.0 & (byte)((uVar7 & 0x20) >> 5);
        iVar19 = 0;
        uVar17 = uVar6 & 0x20;
        do {
          bVar1 = puVar8[(long)(((iVar3 + iVar19) % iVar2 + iVar2) % iVar2) * (long)iVar4];
          dVar23 = (double)bVar1;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((bVar1 != 0) || (uVar17 == 0)) {
LAB_001e9640:
              dVar11 = (pIVar14->ExtentsX).Min;
              dVar12 = (pIVar14->ExtentsX).Max;
              uVar20 = -(ulong)(dVar23 < dVar11);
              uVar21 = -(ulong)(dVar12 < dVar23);
              (pIVar14->ExtentsX).Min = (double)(~uVar20 & (ulong)dVar11 | (ulong)dVar23 & uVar20);
              (pIVar14->ExtentsX).Max = (double)(~uVar21 & (ulong)dVar12 | (ulong)dVar23 & uVar21);
            }
          }
          else if (((pIVar10->YAxis[iVar5].Range.Min <= dVar22) &&
                   (dVar22 <= pIVar10->YAxis[iVar5].Range.Max)) &&
                  (local_8c = (byte)(uVar17 >> 5), (bVar1 == 0 & local_8c) == 0)) goto LAB_001e9640;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((ulong)local_70 < 0x7ff0000000000000 && bVar18 == 0) {
LAB_001e9687:
              dVar23 = pIVar14->ExtentsY[iVar5].Min;
              dVar11 = pIVar14->ExtentsY[iVar5].Max;
              uVar20 = -(ulong)(dVar22 < dVar23);
              uVar21 = -(ulong)(dVar11 < dVar22);
              pIVar14->ExtentsY[iVar5].Min =
                   (double)(~uVar20 & (ulong)dVar23 | (ulong)dVar22 & uVar20);
              pIVar14->ExtentsY[iVar5].Max =
                   (double)(~uVar21 & (ulong)dVar11 | (ulong)dVar22 & uVar21);
            }
          }
          else if (((ulong)local_70 < 0x7ff0000000000000 && bVar18 == 0) &&
                   (dVar23 <= (pIVar10->XAxis).Range.Max && (pIVar10->XAxis).Range.Min <= dVar23))
          goto LAB_001e9687;
          iVar19 = iVar19 + 1;
        } while (iVar2 != iVar19);
      }
    }
    local_80 = getter2;
    local_78 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar14->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar14->NextItemData).Colors + 1);
      iVar2 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar2]) {
      case 0:
        local_84.YAxis = iVar2;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_78,local_80,&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_84.YAxis = iVar2;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLin>
                          *)&local_60,local_78,local_80,(TransformerLogLin *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_84.YAxis = iVar2;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
                          *)&local_60,local_78,local_80,(TransformerLinLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_84.YAxis = iVar2;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLog>
                          *)&local_60,local_78,local_80,(TransformerLogLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar14 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar14->NextItemData);
    pIVar14->PreviousItem = pIVar14->CurrentItem;
    pIVar14->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}